

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_init.c
# Opt level: O0

void detectEWMH(void)

{
  unsigned_long uVar1;
  unsigned_long atomCount;
  Atom *supportedAtoms;
  Window *windowFromChild;
  Window *windowFromRoot;
  
  windowFromChild = (Window *)0x0;
  uVar1 = _glfwGetWindowPropertyX11
                    (_glfw.x11.root,_glfw.x11.NET_SUPPORTING_WM_CHECK,0x21,
                     (uchar **)&windowFromChild);
  if (uVar1 != 0) {
    _glfwGrabErrorHandlerX11();
    supportedAtoms = (Atom *)0x0;
    uVar1 = _glfwGetWindowPropertyX11
                      (*windowFromChild,_glfw.x11.NET_SUPPORTING_WM_CHECK,0x21,
                       (uchar **)&supportedAtoms);
    if (uVar1 == 0) {
      XFree(windowFromChild);
    }
    else {
      _glfwReleaseErrorHandlerX11();
      if (*windowFromChild == *supportedAtoms) {
        XFree(windowFromChild);
        XFree(supportedAtoms);
        atomCount = 0;
        uVar1 = _glfwGetWindowPropertyX11
                          (_glfw.x11.root,_glfw.x11.NET_SUPPORTED,4,(uchar **)&atomCount);
        _glfw.x11.NET_WM_STATE = getSupportedAtom((Atom *)atomCount,uVar1,"_NET_WM_STATE");
        _glfw.x11.NET_WM_STATE_ABOVE =
             getSupportedAtom((Atom *)atomCount,uVar1,"_NET_WM_STATE_ABOVE");
        _glfw.x11.NET_WM_STATE_FULLSCREEN =
             getSupportedAtom((Atom *)atomCount,uVar1,"_NET_WM_STATE_FULLSCREEN");
        _glfw.x11.NET_WM_STATE_MAXIMIZED_VERT =
             getSupportedAtom((Atom *)atomCount,uVar1,"_NET_WM_STATE_MAXIMIZED_VERT");
        _glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ =
             getSupportedAtom((Atom *)atomCount,uVar1,"_NET_WM_STATE_MAXIMIZED_HORZ");
        _glfw.x11.NET_WM_STATE_DEMANDS_ATTENTION =
             getSupportedAtom((Atom *)atomCount,uVar1,"_NET_WM_STATE_DEMANDS_ATTENTION");
        _glfw.x11.NET_WM_FULLSCREEN_MONITORS =
             getSupportedAtom((Atom *)atomCount,uVar1,"_NET_WM_FULLSCREEN_MONITORS");
        _glfw.x11.NET_WM_WINDOW_TYPE =
             getSupportedAtom((Atom *)atomCount,uVar1,"_NET_WM_WINDOW_TYPE");
        _glfw.x11.NET_WM_WINDOW_TYPE_NORMAL =
             getSupportedAtom((Atom *)atomCount,uVar1,"_NET_WM_WINDOW_TYPE_NORMAL");
        _glfw.x11.NET_WORKAREA = getSupportedAtom((Atom *)atomCount,uVar1,"_NET_WORKAREA");
        _glfw.x11.NET_CURRENT_DESKTOP =
             getSupportedAtom((Atom *)atomCount,uVar1,"_NET_CURRENT_DESKTOP");
        _glfw.x11.NET_ACTIVE_WINDOW = getSupportedAtom((Atom *)atomCount,uVar1,"_NET_ACTIVE_WINDOW")
        ;
        _glfw.x11.NET_FRAME_EXTENTS = getSupportedAtom((Atom *)atomCount,uVar1,"_NET_FRAME_EXTENTS")
        ;
        _glfw.x11.NET_REQUEST_FRAME_EXTENTS =
             getSupportedAtom((Atom *)atomCount,uVar1,"_NET_REQUEST_FRAME_EXTENTS");
        if (atomCount != 0) {
          XFree(atomCount);
        }
      }
      else {
        XFree(windowFromChild);
        XFree(supportedAtoms);
      }
    }
  }
  return;
}

Assistant:

static void detectEWMH(void)
{
    // First we read the _NET_SUPPORTING_WM_CHECK property on the root window

    Window* windowFromRoot = NULL;
    if (!_glfwGetWindowPropertyX11(_glfw.x11.root,
                                   _glfw.x11.NET_SUPPORTING_WM_CHECK,
                                   XA_WINDOW,
                                   (unsigned char**) &windowFromRoot))
    {
        return;
    }

    _glfwGrabErrorHandlerX11();

    // If it exists, it should be the XID of a top-level window
    // Then we look for the same property on that window

    Window* windowFromChild = NULL;
    if (!_glfwGetWindowPropertyX11(*windowFromRoot,
                                   _glfw.x11.NET_SUPPORTING_WM_CHECK,
                                   XA_WINDOW,
                                   (unsigned char**) &windowFromChild))
    {
        XFree(windowFromRoot);
        return;
    }

    _glfwReleaseErrorHandlerX11();

    // If the property exists, it should contain the XID of the window

    if (*windowFromRoot != *windowFromChild)
    {
        XFree(windowFromRoot);
        XFree(windowFromChild);
        return;
    }

    XFree(windowFromRoot);
    XFree(windowFromChild);

    // We are now fairly sure that an EWMH-compliant WM is currently running
    // We can now start querying the WM about what features it supports by
    // looking in the _NET_SUPPORTED property on the root window
    // It should contain a list of supported EWMH protocol and state atoms

    Atom* supportedAtoms = NULL;
    const unsigned long atomCount =
        _glfwGetWindowPropertyX11(_glfw.x11.root,
                                  _glfw.x11.NET_SUPPORTED,
                                  XA_ATOM,
                                  (unsigned char**) &supportedAtoms);

    // See which of the atoms we support that are supported by the WM

    _glfw.x11.NET_WM_STATE =
        getSupportedAtom(supportedAtoms, atomCount, "_NET_WM_STATE");
    _glfw.x11.NET_WM_STATE_ABOVE =
        getSupportedAtom(supportedAtoms, atomCount, "_NET_WM_STATE_ABOVE");
    _glfw.x11.NET_WM_STATE_FULLSCREEN =
        getSupportedAtom(supportedAtoms, atomCount, "_NET_WM_STATE_FULLSCREEN");
    _glfw.x11.NET_WM_STATE_MAXIMIZED_VERT =
        getSupportedAtom(supportedAtoms, atomCount, "_NET_WM_STATE_MAXIMIZED_VERT");
    _glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ =
        getSupportedAtom(supportedAtoms, atomCount, "_NET_WM_STATE_MAXIMIZED_HORZ");
    _glfw.x11.NET_WM_STATE_DEMANDS_ATTENTION =
        getSupportedAtom(supportedAtoms, atomCount, "_NET_WM_STATE_DEMANDS_ATTENTION");
    _glfw.x11.NET_WM_FULLSCREEN_MONITORS =
        getSupportedAtom(supportedAtoms, atomCount, "_NET_WM_FULLSCREEN_MONITORS");
    _glfw.x11.NET_WM_WINDOW_TYPE =
        getSupportedAtom(supportedAtoms, atomCount, "_NET_WM_WINDOW_TYPE");
    _glfw.x11.NET_WM_WINDOW_TYPE_NORMAL =
        getSupportedAtom(supportedAtoms, atomCount, "_NET_WM_WINDOW_TYPE_NORMAL");
    _glfw.x11.NET_WORKAREA =
        getSupportedAtom(supportedAtoms, atomCount, "_NET_WORKAREA");
    _glfw.x11.NET_CURRENT_DESKTOP =
        getSupportedAtom(supportedAtoms, atomCount, "_NET_CURRENT_DESKTOP");
    _glfw.x11.NET_ACTIVE_WINDOW =
        getSupportedAtom(supportedAtoms, atomCount, "_NET_ACTIVE_WINDOW");
    _glfw.x11.NET_FRAME_EXTENTS =
        getSupportedAtom(supportedAtoms, atomCount, "_NET_FRAME_EXTENTS");
    _glfw.x11.NET_REQUEST_FRAME_EXTENTS =
        getSupportedAtom(supportedAtoms, atomCount, "_NET_REQUEST_FRAME_EXTENTS");

    if (supportedAtoms)
        XFree(supportedAtoms);
}